

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyWriteTLASCompactedSizeAttribs
               (IRenderDevice *pDevice,WriteTLASCompactedSizeAttribs *Attribs)

{
  RAYTRACING_BUILD_AS_FLAGS RVar1;
  int iVar2;
  BIND_FLAGS BVar3;
  Char *pCVar4;
  long lVar5;
  char (*Args_1) [68];
  undefined4 extraout_var;
  char (*in_RCX) [70];
  char (*Args_1_00) [68];
  undefined1 local_d0 [8];
  string msg_4;
  string msg_3;
  BufferDesc *DstDesc;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  WriteTLASCompactedSizeAttribs *Attribs_local;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = Attribs;
  if (Attribs->pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[48],char[24]>
              ((string *)local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pTLAS must not be null.",(char (*) [24])in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [70])0x427;
    DebugAssertionFailed
              (pCVar4,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x427);
    std::__cxx11::string::~string((string *)local_38);
  }
  lVar5 = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
  RVar1 = operator&(*(RAYTRACING_BUILD_AS_FLAGS *)(lVar5 + 0xc),RAYTRACING_BUILD_AS_ALLOW_COMPACTION
                   );
  if (RVar1 != RAYTRACING_BUILD_AS_ALLOW_COMPACTION) {
    FormatString<char[48],char[70]>
              ((string *)((long)&msg_2.field_2 + 8),
               (Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])
               "pTLAS was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [70])0x429;
    DebugAssertionFailed
              (pCVar4,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x429);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (*(long *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[48],char[30]>
              ((string *)&DstDesc,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer must not be null.",(char (*) [30])in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x42b);
    std::__cxx11::string::~string((string *)&DstDesc);
  }
  Args_1 = (char (*) [68])(**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x20))();
  Args_1_00 = Args_1;
  if (*(ulong *)(*Args_1 + 8) < *(long *)(msg.field_2._8_8_ + 0x10) + 8U) {
    FormatString<char[48],char[26]>
              ((string *)((long)&msg_4.field_2 + 8),
               (Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer is too small.",(char (*) [26])Args_1);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    Args_1_00 = (char (*) [68])0x42e;
    DebugAssertionFailed
              (pCVar4,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x42e);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  if ((*(int *)CONCAT44(extraout_var,iVar2) == 2) &&
     (BVar3 = operator&(*(BIND_FLAGS *)(*Args_1 + 0x10),BIND_UNORDERED_ACCESS),
     BVar3 != BIND_UNORDERED_ACCESS)) {
    FormatString<char[48],char[68]>
              ((string *)local_d0,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer must have been created with BIND_UNORDERED_ACCESS flag.",
               Args_1_00);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x433);
    std::__cxx11::string::~string((string *)local_d0);
  }
  return true;
}

Assistant:

bool VerifyWriteTLASCompactedSizeAttribs(const IRenderDevice* pDevice, const WriteTLASCompactedSizeAttribs& Attribs)
{
#define CHECK_WRITE_TLAS_SIZE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Write compacted TLAS size attribs are invalid: ", __VA_ARGS__)

    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.pTLAS != nullptr, "pTLAS must not be null.");
    CHECK_WRITE_TLAS_SIZE_ATTRIBS((Attribs.pTLAS->GetDesc().Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION,
                                  "pTLAS was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");

    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.pDestBuffer != nullptr, "pDestBuffer must not be null.");

    const BufferDesc& DstDesc = Attribs.pDestBuffer->GetDesc();
    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.DestBufferOffset + sizeof(Uint64) <= DstDesc.Size, "pDestBuffer is too small.");

    if (pDevice->GetDeviceInfo().Type == RENDER_DEVICE_TYPE_D3D12)
    {
        CHECK_WRITE_TLAS_SIZE_ATTRIBS((DstDesc.BindFlags & BIND_UNORDERED_ACCESS) == BIND_UNORDERED_ACCESS,
                                      "pDestBuffer must have been created with BIND_UNORDERED_ACCESS flag.");
    }

#undef CHECK_WRITE_TLAS_SIZE_ATTRIBS

    return true;
}